

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingMessage_Test>
::~ParameterizedTestFactory
          (ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingMessage_Test>
           *this)

{
  ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingMessage_Test>
  *this_local;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_029b9078;
  google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams::
  ~ExtensionDeclarationsTestParams(&this->parameter_);
  TestFactoryBase::~TestFactoryBase(&this->super_TestFactoryBase);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}